

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
VectorInstance::op_removeFirst
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  const_iterator __position;
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RDI;
  iterator it;
  shared_ptr<Instance> instance;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<Instance> *in_stack_ffffffffffffff50;
  allocator *paVar5;
  shared_ptr<Instance> *in_stack_ffffffffffffff58;
  InstanceIsEqualToComparator *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  allocator local_69;
  shared_ptr<Instance> *local_68;
  shared_ptr<Instance> *local_60;
  shared_ptr<Instance> *local_38;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  get_shared_instance(in_stack_ffffffffffffffd8,(string *)in_stack_ffffffffffffffd0._M_current);
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
            (in_stack_ffffffffffffff48);
  do {
    local_38 = (shared_ptr<Instance> *)
               std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::
               end(in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
LAB_001c1320:
      paVar5 = &local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c135e);
      return in_RDI;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                 *)&stack0xffffffffffffffd0);
    uVar2 = InstanceIsEqualToComparator::operator()
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                      );
    if ((bool)uVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>const*,std::vector<std::shared_ptr<Instance>,std::allocator<std::shared_ptr<Instance>>>>
      ::__normal_iterator<std::shared_ptr<Instance>*>
                ((__normal_iterator<const_std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_ffffffffffffff50,
                 (__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                  *)in_stack_ffffffffffffff48);
      __position._M_current._7_1_ = uVar2;
      __position._M_current._0_7_ = in_stack_ffffffffffffff68;
      local_60 = (shared_ptr<Instance> *)
                 std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ::erase((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                          *)in_stack_ffffffffffffff60,__position);
      goto LAB_001c1320;
    }
    local_68 = (shared_ptr<Instance> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
               ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                             *)in_stack_ffffffffffffff58,
                            (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  } while( true );
}

Assistant:

std::string VectorInstance::op_removeFirst(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            _value.erase(it);
            break;
        }
    return "null";
}